

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Swap
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  void *pvVar1;
  unsigned_long *puVar2;
  void **ppvVar3;
  undefined1 local_30 [8];
  RepeatedField<unsigned_long> temp;
  
  if (this != other) {
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    else {
      puVar2 = elements(this);
      ppvVar3 = (void **)(puVar2 + -1);
    }
    pvVar1 = *ppvVar3;
    if (other->total_size_ == 0) {
      ppvVar3 = &other->arena_or_elements_;
    }
    else {
      puVar2 = elements(other);
      ppvVar3 = (void **)(puVar2 + -1);
    }
    if (pvVar1 == *ppvVar3) {
      InternalSwap(this,other);
      return;
    }
    if (other->total_size_ == 0) {
      ppvVar3 = &other->arena_or_elements_;
    }
    else {
      puVar2 = elements(other);
      ppvVar3 = (void **)(puVar2 + -1);
    }
    RepeatedField((RepeatedField<unsigned_long> *)local_30,(Arena *)*ppvVar3);
    MergeFrom((RepeatedField<unsigned_long> *)local_30,this);
    this->current_size_ = 0;
    MergeFrom(this,other);
    if ((RepeatedField<unsigned_long> *)local_30 != other) {
      InternalSwap(other,(RepeatedField<unsigned_long> *)local_30);
    }
    ~RepeatedField((RepeatedField<unsigned_long> *)local_30);
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}